

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O1

void __thiscall embree::AccelN::accels_build(AccelN *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  Accel *pAVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  char cVar9;
  int iVar10;
  task *ptVar11;
  runtime_error *this_00;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  small_object_allocator alloc;
  task_group_context context;
  AccelN **local_e8;
  task_traits local_e0;
  AccelN *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  wait_context local_c0;
  task_group_context local_b0;
  
  if ((this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<embree::Accel_*,_std::allocator<embree::Accel_*>_>,_true>::
    _S_do_it(&this->accels);
  }
  ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppAVar2 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_d8 = this;
  tbb::detail::r1::initialize(&local_b0);
  local_e8 = &local_d8;
  if (ppAVar1 != ppAVar2) {
    local_e0.m_version_and_traits = 0;
    ptVar11 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e0,0xc0);
    ptVar11->m_reserved[3] = 0;
    ptVar11->m_reserved[4] = 0;
    ptVar11->m_reserved[1] = 0;
    ptVar11->m_reserved[2] = 0;
    (ptVar11->super_task_traits).m_version_and_traits = 0;
    ptVar11->m_reserved[0] = 0;
    ptVar11->m_reserved[5] = 0;
    ptVar11->_vptr_task = (_func_int **)&PTR__task_02201980;
    ptVar11[1]._vptr_task = (_func_int **)((long)ppAVar1 - (long)ppAVar2 >> 3);
    ptVar11[1].super_task_traits.m_version_and_traits = 0;
    ptVar11[1].m_reserved[0] = 1;
    ptVar11[1].m_reserved[1] = (uint64_t)&local_e8;
    ptVar11[1].m_reserved[2] = 0;
    ptVar11[1].m_reserved[3] = 1;
    iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar11[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar11[2]._vptr_task + 4) = 5;
    ptVar11[1].m_reserved[5] = ((long)iVar10 & 0x3fffffffffffffffU) * 2;
    ptVar11[2].super_task_traits.m_version_and_traits = local_e0.m_version_and_traits;
    local_d0 = 0;
    local_c8 = 1;
    local_c0.m_version_and_traits = 1;
    local_c0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar11[1].m_reserved[4] = (uint64_t)&local_d0;
    tbb::detail::r1::execute_and_wait(ptVar11,&local_b0,&local_c0,&local_b0);
  }
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar9 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_b0);
  ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)ppAVar2 - (long)ppAVar1 >> 3;
  if (ppAVar2 == ppAVar1) {
    pcVar14 = "AccelN::intersector8";
    pcVar17 = "AccelN::intersector4";
    pcVar15 = "AccelN::intersector1";
    pcVar13 = "AccelN::intersector16";
  }
  else {
    bVar7 = true;
    lVar16 = 0;
    bVar6 = true;
    bVar5 = true;
    bVar4 = true;
    do {
      pAVar3 = ppAVar1[lVar16];
      bVar4 = (bool)(bVar4 & *(long *)&pAVar3->field_0x90 != 0);
      bVar5 = (bool)(bVar5 & *(long *)&pAVar3->field_0xa8 != 0);
      bVar6 = (bool)(bVar6 & *(long *)&pAVar3->field_0xf0 != 0);
      bVar7 = (bool)(bVar7 & *(long *)&pAVar3->field_0x138 != 0);
      lVar16 = lVar16 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar16);
    pcVar18 = (char *)0x0;
    pcVar15 = "AccelN::intersector1";
    if (!bVar4) {
      pcVar15 = pcVar18;
    }
    pcVar17 = "AccelN::intersector4";
    if (!bVar5) {
      pcVar17 = pcVar18;
    }
    pcVar14 = "AccelN::intersector8";
    if (!bVar6) {
      pcVar14 = pcVar18;
    }
    pcVar13 = "AccelN::intersector16";
    if (!bVar7) {
      pcVar13 = pcVar18;
    }
  }
  if ((long)ppAVar2 - (long)ppAVar1 == 8) {
    (this->super_Accel).super_AccelData.type = ((*ppAVar1)->super_AccelData).type;
    pAVar3 = *ppAVar1;
    uVar8 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds0.lower.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 =
         *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds0.lower.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 + 8) =
         uVar8;
    uVar8 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds0.upper.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 =
         *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds0.upper.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 + 8) =
         uVar8;
    uVar8 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds1.lower.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 =
         *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds1.lower.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 + 8) =
         uVar8;
    uVar8 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds1.upper.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 =
         *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds1.upper.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 + 8) =
         uVar8;
    memcpy(&(this->super_Accel).super_AccelData.field_0x58,&((*ppAVar1)->super_AccelData).field_0x58
           ,0x118);
  }
  else {
    (this->super_Accel).super_AccelData.type = TY_ACCELN;
    *(AccelN **)&(this->super_Accel).super_AccelData.field_0x58 = this;
    *(code **)&(this->super_Accel).field_0x78 = intersect;
    *(code **)&(this->super_Accel).field_0x80 = occluded;
    *(code **)&(this->super_Accel).field_0x88 = pointQuery;
    *(char **)&(this->super_Accel).field_0x90 = pcVar15;
    *(code **)&(this->super_Accel).field_0x98 = intersect4;
    *(code **)&(this->super_Accel).field_0xa0 = occluded4;
    *(char **)&(this->super_Accel).field_0xa8 = pcVar17;
    *(code **)&(this->super_Accel).field_0xe0 = intersect8;
    *(code **)&(this->super_Accel).field_0xe8 = occluded8;
    *(char **)&(this->super_Accel).field_0xf0 = pcVar14;
    *(code **)&(this->super_Accel).field_0x128 = intersect16;
    *(code **)&(this->super_Accel).field_0x130 = occluded16;
    *(char **)&(this->super_Accel).field_0x138 = pcVar13;
    aVar19 = _DAT_01feb9f0;
    (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = _DAT_01feb9f0;
    aVar20 = _DAT_01feba00;
    (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = _DAT_01feba00;
    (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar19;
    (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar20;
    if (ppAVar2 != ppAVar1) {
      aVar21 = (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0;
      lVar16 = 0;
      aVar22 = aVar20;
      do {
        pAVar3 = ppAVar1[lVar16];
        aVar21.m128 = (__m128)minps(aVar21.m128,
                                    (pAVar3->super_AccelData).bounds.bounds0.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = aVar21;
        aVar20.m128 = (__m128)maxps(aVar20.m128,
                                    (pAVar3->super_AccelData).bounds.bounds0.upper.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = aVar20;
        aVar19.m128 = (__m128)minps(aVar19.m128,
                                    (pAVar3->super_AccelData).bounds.bounds1.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar19;
        aVar22.m128 = (__m128)maxps(aVar22.m128,
                                    (pAVar3->super_AccelData).bounds.bounds1.upper.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar22;
        lVar16 = lVar16 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar16);
    }
  }
  return;
}

Assistant:

void AccelN::accels_build () 
  {
    /* reduce memory consumption */
    accels.shrink_to_fit();
    
    /* build all acceleration structures in parallel */
    parallel_for (accels.size(), [&] (size_t i) { 
        accels[i]->build();
      });

    /* create list of non-empty acceleration structures */
    bool valid1 = true;
    bool valid4 = true;
    bool valid8 = true;
    bool valid16 = true;
    for (size_t i=0; i<accels.size(); i++) {
      valid1 &= (bool) accels[i]->intersectors.intersector1;
      valid4 &= (bool) accels[i]->intersectors.intersector4;
      valid8 &= (bool) accels[i]->intersectors.intersector8;
      valid16 &= (bool) accels[i]->intersectors.intersector16;
    }

    if (accels.size() == 1) {
      type = accels[0]->type; // FIXME: should just assign entire Accel
      bounds = accels[0]->bounds;
      intersectors = accels[0]->intersectors;
    }
    else 
    {
      type = AccelData::TY_ACCELN;
      intersectors.ptr = this;
      intersectors.intersector1  = Intersector1(&intersect,&occluded,&pointQuery,valid1 ? "AccelN::intersector1": nullptr);
      intersectors.intersector4  = Intersector4(&intersect4,&occluded4,valid4 ? "AccelN::intersector4" : nullptr);
      intersectors.intersector8  = Intersector8(&intersect8,&occluded8,valid8 ? "AccelN::intersector8" : nullptr);
      intersectors.intersector16 = Intersector16(&intersect16,&occluded16,valid16 ? "AccelN::intersector16": nullptr);

      /*! calculate bounds */
      bounds = empty;
      for (size_t i=0; i<accels.size(); i++) 
        bounds.extend(accels[i]->bounds);
    }
  }